

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O3

bool __thiscall
prometheus::Family<prometheus::Info>::Has(Family<prometheus::Info> *this,Labels *labels)

{
  mutex *__mutex;
  int iVar1;
  const_iterator cVar2;
  undefined8 uVar3;
  
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    cVar2 = ::std::_Hashtable<$f11be170$>::find(&(this->metrics_)._M_h,labels);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return cVar2.
           super__Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Info,_std::default_delete<prometheus::Info>_>_>,_true>
           ._M_cur != (__node_type *)0x0;
  }
  uVar3 = ::std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

bool Family<T>::Has(const Labels& labels) const {
  std::lock_guard<std::mutex> lock{mutex_};
  return metrics_.count(labels) != 0u;
}